

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Node::traverseType
          (Node *this,Reader *type,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  uint uVar1;
  undefined2 *puVar2;
  uint64_t depId;
  Reader local_c8;
  Reader local_98;
  Reader local_68;
  
  local_c8._reader.data = (void *)0x0;
  local_c8._reader.pointers._0_6_ = 0;
  local_c8._reader.pointers._6_2_ = 0;
  local_c8._reader.dataSize = 0;
  local_c8._reader.pointerCount = 0;
  local_c8._reader.segment = (SegmentReader *)0x0;
  local_c8._reader.capTable = (CapTableReader *)0x0;
  local_c8._reader.nestingLimit = 0x7fffffff;
  uVar1 = (type->_reader).dataSize;
  if (uVar1 < 0x10) {
    return;
  }
  puVar2 = (undefined2 *)(type->_reader).data;
  switch(*puVar2) {
  case 0xe:
    local_68._reader.segment = (type->_reader).segment;
    local_68._reader.capTable = (type->_reader).capTable;
    local_68._reader.data = (type->_reader).data;
    local_68._reader.pointers = (type->_reader).pointers;
    local_68._reader.dataSize = (type->_reader).dataSize;
    local_68._reader.pointerCount = (type->_reader).pointerCount;
    local_68._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
    local_68._reader.nestingLimit = (type->_reader).nestingLimit;
    local_68._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
    capnp::schema::Type::List::Reader::getElementType(&local_98,&local_68);
    traverseType(this,&local_98,eagerness,seen,finalLoader,sourceInfo);
    return;
  case 0xf:
    if (uVar1 < 0x80) {
      depId = 0;
    }
    else {
      depId = *(uint64_t *)(puVar2 + 4);
    }
    local_98._reader.segment = (type->_reader).segment;
    local_98._reader.capTable = (type->_reader).capTable;
    local_98._reader.data = (type->_reader).data;
    local_98._reader.pointers = (type->_reader).pointers;
    local_98._reader.dataSize = (type->_reader).dataSize;
    local_98._reader.pointerCount = (type->_reader).pointerCount;
    local_98._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
    local_98._reader.nestingLimit = (type->_reader).nestingLimit;
    local_98._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
    capnp::schema::Type::Enum::Reader::getBrand(&local_c8,(Reader *)&local_98);
    break;
  case 0x10:
    if (uVar1 < 0x80) {
      depId = 0;
    }
    else {
      depId = *(uint64_t *)(puVar2 + 4);
    }
    local_98._reader.segment = (type->_reader).segment;
    local_98._reader.capTable = (type->_reader).capTable;
    local_98._reader.data = (type->_reader).data;
    local_98._reader.pointers = (type->_reader).pointers;
    local_98._reader.dataSize = (type->_reader).dataSize;
    local_98._reader.pointerCount = (type->_reader).pointerCount;
    local_98._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
    local_98._reader.nestingLimit = (type->_reader).nestingLimit;
    local_98._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
    capnp::schema::Type::Struct::Reader::getBrand(&local_c8,(Reader *)&local_98);
    break;
  case 0x11:
    if (uVar1 < 0x80) {
      depId = 0;
    }
    else {
      depId = *(uint64_t *)(puVar2 + 4);
    }
    local_98._reader.segment = (type->_reader).segment;
    local_98._reader.capTable = (type->_reader).capTable;
    local_98._reader.data = (type->_reader).data;
    local_98._reader.pointers = (type->_reader).pointers;
    local_98._reader.dataSize = (type->_reader).dataSize;
    local_98._reader.pointerCount = (type->_reader).pointerCount;
    local_98._reader._38_2_ = *(undefined2 *)&(type->_reader).field_0x26;
    local_98._reader.nestingLimit = (type->_reader).nestingLimit;
    local_98._reader._44_4_ = *(undefined4 *)&(type->_reader).field_0x2c;
    capnp::schema::Type::Interface::Reader::getBrand(&local_c8,(Reader *)&local_98);
    break;
  default:
    goto switchD_002071bf_default;
  }
  traverseDependency(this,depId,eagerness,seen,finalLoader,sourceInfo,false);
  traverseBrand(this,&local_c8,eagerness,seen,finalLoader,sourceInfo);
switchD_002071bf_default:
  return;
}

Assistant:

void Compiler::Node::traverseType(const schema::Type::Reader& type, uint eagerness,
                                  std::unordered_map<Node*, uint>& seen,
                                  const SchemaLoader& finalLoader,
                                  kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint64_t id = 0;
  schema::Brand::Reader brand;
  switch (type.which()) {
    case schema::Type::STRUCT:
      id = type.getStruct().getTypeId();
      brand = type.getStruct().getBrand();
      break;
    case schema::Type::ENUM:
      id = type.getEnum().getTypeId();
      brand = type.getEnum().getBrand();
      break;
    case schema::Type::INTERFACE:
      id = type.getInterface().getTypeId();
      brand = type.getInterface().getBrand();
      break;
    case schema::Type::LIST:
      traverseType(type.getList().getElementType(), eagerness, seen, finalLoader, sourceInfo);
      return;
    default:
      return;
  }

  traverseDependency(id, eagerness, seen, finalLoader, sourceInfo);
  traverseBrand(brand, eagerness, seen, finalLoader, sourceInfo);
}